

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

void nhdp_domain_init_neighbor(nhdp_neighbor *neigh)

{
  int iVar1;
  list_entity *plVar2;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  int i;
  nhdp_neighbor_domaindata *data;
  nhdp_domain *domain;
  nhdp_neighbor *neigh_local;
  
  for (__tempptr._4_4_ = 0; plVar2 = _domain_list.next, __tempptr._4_4_ < 4;
      __tempptr._4_4_ = __tempptr._4_4_ + 1) {
    neigh->_domaindata[__tempptr._4_4_].metric.in = 0xffffff;
    neigh->_domaindata[__tempptr._4_4_].metric.out = 0xffffff;
    neigh->_domaindata[__tempptr._4_4_].best_out_link = (nhdp_link *)0x0;
    neigh->_domaindata[__tempptr._4_4_].best_out_link_metric = 0xffffff;
    neigh->_domaindata[__tempptr._4_4_].willingness = '\0';
    neigh->_domaindata[__tempptr._4_4_].local_is_mpr = false;
    neigh->_domaindata[__tempptr._4_4_].neigh_is_mpr = false;
  }
  for (; plVar2->prev != _domain_list.prev; plVar2 = plVar2->next) {
    iVar1 = *(int *)((long)&plVar2[-0x27].next + 4);
    if (((ulong)plVar2[-0x28].next[2].next & 1) != 0) {
      neigh->_domaindata[iVar1].metric.in = *(uint32_t *)&plVar2[-0x28].next[1].next;
      neigh->_domaindata[iVar1].metric.out = *(uint32_t *)((long)&plVar2[-0x28].next[1].next + 4);
    }
  }
  return;
}

Assistant:

void
nhdp_domain_init_neighbor(struct nhdp_neighbor *neigh) {
  struct nhdp_domain *domain;
  struct nhdp_neighbor_domaindata *data;
  int i;

  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    neigh->_domaindata[i].metric.in = RFC7181_METRIC_INFINITE;
    neigh->_domaindata[i].metric.out = RFC7181_METRIC_INFINITE;

    neigh->_domaindata[i].best_out_link = NULL;
    neigh->_domaindata[i].best_out_link_metric = RFC7181_METRIC_INFINITE;
    neigh->_domaindata[i].willingness = RFC7181_WILLINGNESS_NEVER;

    neigh->_domaindata[i].local_is_mpr = false;
    neigh->_domaindata[i].neigh_is_mpr = false;
  }

  /* initialize metrics and mprs */
  list_for_each_element(&_domain_list, domain, _node) {
    data = nhdp_domain_get_neighbordata(domain, neigh);

    if (domain->metric->no_default_handling) {
      data->metric.in = domain->metric->incoming_link_start;
      data->metric.out = domain->metric->outgoing_link_start;
    }
  }
}